

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool tt_face_get_colr_layer
                  (TT_Face face,FT_UInt base_glyph,FT_UInt *aglyph_index,FT_UInt *acolor_index,
                  FT_LayerIterator *iterator)

{
  FT_Bool FVar1;
  FT_ULong offset;
  void *pvStack_40;
  BaseGlyphRecord glyph_record;
  Colr *colr;
  FT_LayerIterator *iterator_local;
  FT_UInt *acolor_index_local;
  FT_UInt *aglyph_index_local;
  FT_UInt base_glyph_local;
  TT_Face face_local;
  
  pvStack_40 = face->colr;
  if (pvStack_40 == (void *)0x0) {
    return '\0';
  }
  if (iterator->p == (FT_Byte *)0x0) {
    iterator->layer = 0;
    FVar1 = find_base_glyph_record
                      (*(FT_Byte **)((long)pvStack_40 + 8),(uint)*(ushort *)((long)pvStack_40 + 2),
                       base_glyph,(BaseGlyphRecord *)((long)&offset + 2));
    if (FVar1 == '\0') {
      return '\0';
    }
    if (offset._6_2_ == 0) {
      return '\0';
    }
    iterator->num_layers = (uint)offset._6_2_;
    if (*(ulong *)((long)pvStack_40 + 0x88) < (ulong)offset._4_2_ * 4 + (ulong)offset._6_2_ * 4) {
      return '\0';
    }
    iterator->p = (FT_Byte *)(*(long *)((long)pvStack_40 + 0x10) + (ulong)offset._4_2_ * 4);
  }
  if (((iterator->layer < iterator->num_layers) &&
      (*(FT_Byte **)((long)pvStack_40 + 0x10) <= iterator->p)) &&
     (iterator->p <
      (FT_Byte *)(*(long *)((long)pvStack_40 + 0x80) + *(long *)((long)pvStack_40 + 0x88)))) {
    iterator->p = iterator->p + 2;
    *aglyph_index = (uint)CONCAT11(iterator->p[-2],iterator->p[-1]);
    iterator->p = iterator->p + 2;
    *acolor_index = (uint)CONCAT11(iterator->p[-2],iterator->p[-1]);
    if ((*aglyph_index < (uint)(face->root).num_glyphs) &&
       ((*acolor_index == 0xffff || (*acolor_index < (uint)(face->palette_data).num_palette_entries)
        ))) {
      iterator->layer = iterator->layer + 1;
      face_local._7_1_ = '\x01';
    }
    else {
      face_local._7_1_ = '\0';
    }
  }
  else {
    face_local._7_1_ = '\0';
  }
  return face_local._7_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_colr_layer( TT_Face            face,
                          FT_UInt            base_glyph,
                          FT_UInt           *aglyph_index,
                          FT_UInt           *acolor_index,
                          FT_LayerIterator*  iterator )
  {
    Colr*            colr = (Colr*)face->colr;
    BaseGlyphRecord  glyph_record;


    if ( !colr )
      return 0;

    if ( !iterator->p )
    {
      FT_ULong  offset;


      /* first call to function */
      iterator->layer = 0;

      if ( !find_base_glyph_record( colr->base_glyphs,
                                    colr->num_base_glyphs,
                                    base_glyph,
                                    &glyph_record ) )
        return 0;

      if ( glyph_record.num_layers )
        iterator->num_layers = glyph_record.num_layers;
      else
        return 0;

      offset = LAYER_SIZE * glyph_record.first_layer_index;
      if ( offset + LAYER_SIZE * glyph_record.num_layers > colr->table_size )
        return 0;

      iterator->p = colr->layers + offset;
    }

    if ( iterator->layer >= iterator->num_layers                     ||
         iterator->p < colr->layers                                  ||
         iterator->p >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    *aglyph_index = FT_NEXT_USHORT( iterator->p );
    *acolor_index = FT_NEXT_USHORT( iterator->p );

    if ( *aglyph_index >= (FT_UInt)( FT_FACE( face )->num_glyphs )   ||
         ( *acolor_index != 0xFFFF                                 &&
           *acolor_index >= face->palette_data.num_palette_entries ) )
      return 0;

    iterator->layer++;

    return 1;
  }